

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

string * __thiscall
google::protobuf::MessageLite::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  ClassDataFull *pCVar3;
  char *in_RCX;
  string local_e8;
  Hex local_c0;
  AlphaNum local_b0;
  AlphaNum local_80;
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  ClassData *local_20;
  ClassData *data;
  MessageLite *this_local;
  
  data = (ClassData *)this;
  this_local = (MessageLite *)__return_storage_ptr__;
  iVar1 = (*this->_vptr_MessageLite[4])();
  local_20 = (ClassData *)CONCAT44(extraout_var,iVar1);
  local_39 = 0;
  if (local_20 == (ClassData *)0x0) {
    in_RCX = "data != nullptr";
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x90,"data != nullptr");
    local_39 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((local_39 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  if ((local_20->is_lite & 1U) == 0) {
    pCVar3 = internal::ClassData::full(local_20);
    (*pCVar3->descriptor_methods->debug_string)(__return_storage_ptr__,this);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_80,"MessageLite at 0x");
    absl::lts_20250127::Hex::Hex<google::protobuf::MessageLite_const>(&local_c0,this,kNoPad);
    local_e8.field_2._M_allocated_capacity = 0;
    local_e8.field_2._8_8_ = 0;
    local_e8._M_dataplus = (_Alloc_hider)0x0;
    local_e8._1_7_ = 0;
    local_e8._M_string_length = 0;
    absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_e8);
    absl::lts_20250127::AlphaNum::AlphaNum<absl::lts_20250127::Hex,void>
              (&local_b0,&local_c0,(StringifySink *)&local_e8);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_80,&local_b0,(AlphaNum *)in_RCX);
    absl::lts_20250127::strings_internal::StringifySink::~StringifySink((StringifySink *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageLite::DebugString() const {
  auto* data = GetClassData();
  ABSL_DCHECK(data != nullptr);
  if (!data->is_lite) {
    return data->full().descriptor_methods->debug_string(*this);
  }

  return absl::StrCat("MessageLite at 0x", absl::Hex(this));
}